

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::AppendCustomCommandToOutput
          (cmMakefile *this,string *output,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,cmImplicitDependsList *implicit_depends,cmCustomCommandLines *commandLines)

{
  bool bVar1;
  anon_class_112_5_0c129092 local_a0;
  cmCustomCommandLines *local_30;
  cmCustomCommandLines *commandLines_local;
  cmImplicitDependsList *implicit_depends_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *depends_local;
  string *output_local;
  cmMakefile *this_local;
  
  local_30 = commandLines;
  commandLines_local = (cmCustomCommandLines *)implicit_depends;
  implicit_depends_local = (cmImplicitDependsList *)depends;
  depends_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)output;
  output_local = (string *)this;
  bVar1 = ValidateCustomCommand(this,commandLines);
  if (bVar1) {
    local_a0.this = this;
    std::__cxx11::string::string((string *)&local_a0.output,(string *)depends_local);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_a0.depends,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)implicit_depends_local);
    cmImplicitDependsList::cmImplicitDependsList
              (&local_a0.implicit_depends,(cmImplicitDependsList *)commandLines_local);
    cmCustomCommandLines::cmCustomCommandLines(&local_a0.commandLines,local_30);
    AddGeneratorAction<cmMakefile::AppendCustomCommandToOutput(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmImplicitDependsList_const&,cmCustomCommandLines_const&)::__0>
              (this,&local_a0);
    AppendCustomCommandToOutput(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmImplicitDependsList_const&,cmCustomCommandLines_const&)
    ::$_0::~__0((__0 *)&local_a0);
  }
  return;
}

Assistant:

void cmMakefile::AppendCustomCommandToOutput(
  const std::string& output, const std::vector<std::string>& depends,
  const cmImplicitDependsList& implicit_depends,
  const cmCustomCommandLines& commandLines)
{
  // Validate custom commands.
  if (this->ValidateCustomCommand(commandLines)) {
    // Dispatch command creation to allow generator expressions in outputs.
    this->AddGeneratorAction(
      [=](cmLocalGenerator& lg, const cmListFileBacktrace& lfbt) {
        BacktraceGuard guard(this->Backtrace, lfbt);
        detail::AppendCustomCommandToOutput(lg, lfbt, output, depends,
                                            implicit_depends, commandLines);
      });
  }
}